

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundline_intersector.h
# Opt level: O3

void __thiscall
embree::avx::__roundline_internal::ConeGeometryIntersector<8>::ConeGeometryIntersector
          (ConeGeometryIntersector<8> *this,Vec3vf<8> *ray_org,Vec3vf<8> *ray_dir,vfloat<8> *dOdO,
          vfloat<8> *rcp_dOdO,Vec4vf<8> *a,Vec4vf<8> *b)

{
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 aVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  
  ConeGeometry<8>::ConeGeometry(&this->super_ConeGeometry<8>,a,b);
  uVar49 = *(undefined8 *)((long)&ray_org->field_0 + 8);
  uVar50 = *(undefined8 *)((long)&ray_org->field_0 + 0x10);
  uVar51 = *(undefined8 *)((long)&ray_org->field_0 + 0x18);
  *(undefined8 *)&(this->org).field_0 = *(undefined8 *)&ray_org->field_0;
  *(undefined8 *)((long)&(this->org).field_0 + 8) = uVar49;
  *(undefined8 *)((long)&(this->org).field_0 + 0x10) = uVar50;
  *(undefined8 *)((long)&(this->org).field_0 + 0x18) = uVar51;
  uVar49 = *(undefined8 *)((long)&ray_org->field_0 + 0x28);
  uVar50 = *(undefined8 *)((long)&ray_org->field_0 + 0x30);
  uVar51 = *(undefined8 *)((long)&ray_org->field_0 + 0x38);
  *(undefined8 *)((long)&(this->org).field_0 + 0x20) =
       *(undefined8 *)((long)&ray_org->field_0 + 0x20);
  *(undefined8 *)((long)&(this->org).field_0 + 0x28) = uVar49;
  *(undefined8 *)((long)&(this->org).field_0 + 0x30) = uVar50;
  *(undefined8 *)((long)&(this->org).field_0 + 0x38) = uVar51;
  aVar1 = (ray_org->field_0).field_0.z.field_0;
  (this->org).field_0.field_0.z.field_0 = aVar1;
  auVar2 = vsubps_avx((undefined1  [32])(ray_org->field_0).field_0.x.field_0,
                      (undefined1  [32])(this->super_ConeGeometry<8>).p0.field_0.field_0.x.field_0);
  auVar3 = vsubps_avx((undefined1  [32])(ray_org->field_0).field_0.y.field_0,
                      (undefined1  [32])(this->super_ConeGeometry<8>).p0.field_0.field_0.y.field_0);
  auVar4 = vsubps_avx((undefined1  [32])aVar1,
                      (undefined1  [32])(this->super_ConeGeometry<8>).p0.field_0.field_0.z.field_0);
  *(undefined1 (*) [32])&(this->O).field_0 = auVar2;
  *(undefined1 (*) [32])((long)&(this->O).field_0 + 0x20) = auVar3;
  *(undefined1 (*) [32])((long)&(this->O).field_0 + 0x40) = auVar4;
  fVar6 = *(float *)&ray_dir->field_0;
  fVar7 = *(float *)((long)&ray_dir->field_0 + 4);
  fVar8 = *(float *)((long)&ray_dir->field_0 + 8);
  fVar9 = *(float *)((long)&ray_dir->field_0 + 0xc);
  fVar10 = *(float *)((long)&ray_dir->field_0 + 0x10);
  fVar11 = *(float *)((long)&ray_dir->field_0 + 0x14);
  fVar12 = *(float *)((long)&ray_dir->field_0 + 0x18);
  uVar13 = *(undefined4 *)((long)&ray_dir->field_0 + 0x1c);
  *(float *)&(this->dO).field_0 = fVar6;
  *(float *)((long)&(this->dO).field_0 + 4) = fVar7;
  *(float *)((long)&(this->dO).field_0 + 8) = fVar8;
  *(float *)((long)&(this->dO).field_0 + 0xc) = fVar9;
  *(float *)((long)&(this->dO).field_0 + 0x10) = fVar10;
  *(float *)((long)&(this->dO).field_0 + 0x14) = fVar11;
  *(float *)((long)&(this->dO).field_0 + 0x18) = fVar12;
  *(undefined4 *)((long)&(this->dO).field_0 + 0x1c) = uVar13;
  fVar14 = *(float *)((long)&ray_dir->field_0 + 0x20);
  fVar15 = *(float *)((long)&ray_dir->field_0 + 0x24);
  fVar16 = *(float *)((long)&ray_dir->field_0 + 0x28);
  fVar17 = *(float *)((long)&ray_dir->field_0 + 0x2c);
  fVar18 = *(float *)((long)&ray_dir->field_0 + 0x30);
  fVar19 = *(float *)((long)&ray_dir->field_0 + 0x34);
  fVar20 = *(float *)((long)&ray_dir->field_0 + 0x38);
  uVar13 = *(undefined4 *)((long)&ray_dir->field_0 + 0x3c);
  *(float *)((long)&(this->dO).field_0 + 0x20) = fVar14;
  *(float *)((long)&(this->dO).field_0 + 0x24) = fVar15;
  *(float *)((long)&(this->dO).field_0 + 0x28) = fVar16;
  *(float *)((long)&(this->dO).field_0 + 0x2c) = fVar17;
  *(float *)((long)&(this->dO).field_0 + 0x30) = fVar18;
  *(float *)((long)&(this->dO).field_0 + 0x34) = fVar19;
  *(float *)((long)&(this->dO).field_0 + 0x38) = fVar20;
  *(undefined4 *)((long)&(this->dO).field_0 + 0x3c) = uVar13;
  fVar21 = *(float *)((long)&ray_dir->field_0 + 0x40);
  fVar22 = *(float *)((long)&ray_dir->field_0 + 0x44);
  fVar23 = *(float *)((long)&ray_dir->field_0 + 0x48);
  fVar24 = *(float *)((long)&ray_dir->field_0 + 0x4c);
  fVar25 = *(float *)((long)&ray_dir->field_0 + 0x50);
  fVar26 = *(float *)((long)&ray_dir->field_0 + 0x54);
  fVar27 = *(float *)((long)&ray_dir->field_0 + 0x58);
  uVar13 = *(undefined4 *)((long)&ray_dir->field_0 + 0x5c);
  *(float *)((long)&(this->dO).field_0 + 0x40) = fVar21;
  *(float *)((long)&(this->dO).field_0 + 0x44) = fVar22;
  *(float *)((long)&(this->dO).field_0 + 0x48) = fVar23;
  *(float *)((long)&(this->dO).field_0 + 0x4c) = fVar24;
  *(float *)((long)&(this->dO).field_0 + 0x50) = fVar25;
  *(float *)((long)&(this->dO).field_0 + 0x54) = fVar26;
  *(float *)((long)&(this->dO).field_0 + 0x58) = fVar27;
  *(undefined4 *)((long)&(this->dO).field_0 + 0x5c) = uVar13;
  uVar49 = *(undefined8 *)((long)&dOdO->field_0 + 8);
  uVar50 = *(undefined8 *)((long)&dOdO->field_0 + 0x10);
  uVar51 = *(undefined8 *)((long)&dOdO->field_0 + 0x18);
  *(undefined8 *)&(this->dOdO).field_0 = *(undefined8 *)&dOdO->field_0;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 8) = uVar49;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 0x10) = uVar50;
  *(undefined8 *)((long)&(this->dOdO).field_0 + 0x18) = uVar51;
  uVar49 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 8);
  uVar50 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 0x10);
  uVar51 = *(undefined8 *)((long)&rcp_dOdO->field_0 + 0x18);
  *(undefined8 *)&(this->rcp_dOdO).field_0 = *(undefined8 *)&rcp_dOdO->field_0;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 8) = uVar49;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 0x10) = uVar50;
  *(undefined8 *)((long)&(this->rcp_dOdO).field_0 + 0x18) = uVar51;
  fVar28 = *(float *)&(this->super_ConeGeometry<8>).dP.field_0;
  fVar29 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 4);
  fVar30 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 8);
  fVar31 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0xc);
  fVar32 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x10);
  fVar33 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x14);
  fVar34 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x18);
  fVar35 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x20);
  fVar36 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x24);
  fVar37 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x28);
  fVar38 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x2c);
  fVar39 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x30);
  fVar40 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x34);
  fVar41 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x38);
  fVar42 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x40);
  fVar43 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x44);
  fVar44 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x48);
  fVar45 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x4c);
  fVar46 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x50);
  fVar47 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x54);
  fVar48 = *(float *)((long)&(this->super_ConeGeometry<8>).dP.field_0 + 0x58);
  fVar5 = auVar3._28_4_;
  fVar52 = fVar42 * auVar4._0_4_ + auVar3._0_4_ * fVar35 + auVar2._0_4_ * fVar28;
  fVar53 = fVar43 * auVar4._4_4_ + auVar3._4_4_ * fVar36 + auVar2._4_4_ * fVar29;
  fVar54 = fVar44 * auVar4._8_4_ + auVar3._8_4_ * fVar37 + auVar2._8_4_ * fVar30;
  fVar55 = fVar45 * auVar4._12_4_ + auVar3._12_4_ * fVar38 + auVar2._12_4_ * fVar31;
  fVar56 = fVar46 * auVar4._16_4_ + auVar3._16_4_ * fVar39 + auVar2._16_4_ * fVar32;
  fVar57 = fVar47 * auVar4._20_4_ + auVar3._20_4_ * fVar40 + auVar2._20_4_ * fVar33;
  fVar58 = fVar48 * auVar4._24_4_ + auVar3._24_4_ * fVar41 + auVar2._24_4_ * fVar34;
  fVar59 = auVar4._28_4_ + fVar5 + auVar2._28_4_;
  (this->OdP).field_0.v[0] = fVar52;
  (this->OdP).field_0.v[1] = fVar53;
  (this->OdP).field_0.v[2] = fVar54;
  (this->OdP).field_0.v[3] = fVar55;
  (this->OdP).field_0.v[4] = fVar56;
  (this->OdP).field_0.v[5] = fVar57;
  (this->OdP).field_0.v[6] = fVar58;
  (this->OdP).field_0.v[7] = fVar59;
  (this->dOdP).field_0.v[0] = fVar42 * fVar21 + fVar14 * fVar35 + fVar6 * fVar28;
  (this->dOdP).field_0.v[1] = fVar43 * fVar22 + fVar15 * fVar36 + fVar7 * fVar29;
  (this->dOdP).field_0.v[2] = fVar44 * fVar23 + fVar16 * fVar37 + fVar8 * fVar30;
  (this->dOdP).field_0.v[3] = fVar45 * fVar24 + fVar17 * fVar38 + fVar9 * fVar31;
  (this->dOdP).field_0.v[4] = fVar46 * fVar25 + fVar18 * fVar39 + fVar10 * fVar32;
  (this->dOdP).field_0.v[5] = fVar47 * fVar26 + fVar19 * fVar40 + fVar11 * fVar33;
  (this->dOdP).field_0.v[6] = fVar48 * fVar27 + fVar20 * fVar41 + fVar12 * fVar34;
  (this->dOdP).field_0.v[7] = auVar2._28_4_ + fVar5 + fVar5;
  fVar5 = (this->super_ConeGeometry<8>).r0dr.field_0.v[1];
  fVar6 = (this->super_ConeGeometry<8>).r0dr.field_0.v[2];
  fVar7 = (this->super_ConeGeometry<8>).r0dr.field_0.v[3];
  fVar8 = (this->super_ConeGeometry<8>).r0dr.field_0.v[4];
  fVar9 = (this->super_ConeGeometry<8>).r0dr.field_0.v[5];
  fVar10 = (this->super_ConeGeometry<8>).r0dr.field_0.v[6];
  fVar11 = (this->super_ConeGeometry<8>).r0dr.field_0.v[7];
  (this->yp).field_0.v[0] = fVar52 + (this->super_ConeGeometry<8>).r0dr.field_0.v[0];
  (this->yp).field_0.v[1] = fVar53 + fVar5;
  (this->yp).field_0.v[2] = fVar54 + fVar6;
  (this->yp).field_0.v[3] = fVar55 + fVar7;
  (this->yp).field_0.v[4] = fVar56 + fVar8;
  (this->yp).field_0.v[5] = fVar57 + fVar9;
  (this->yp).field_0.v[6] = fVar58 + fVar10;
  (this->yp).field_0.v[7] = fVar59 + fVar11;
  return;
}

Assistant:

ConeGeometryIntersector (const Vec3vf<M>& ray_org, const Vec3vf<M>& ray_dir, const vfloat<M>& dOdO, const vfloat<M>& rcp_dOdO, const Vec4vf<M>& a, const Vec4vf<M>& b)
          : ConeGeometry<M>(a,b), org(ray_org), O(ray_org-p0), dO(ray_dir),  dOdO(dOdO), rcp_dOdO(rcp_dOdO), OdP(dot(dP,O)), dOdP(dot(dP,dO)),  yp(OdP + r0dr) {}